

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-scanner.hpp
# Opt level: O0

optional<long_long> __thiscall
yactfr::internal::StrScanner::tryScanConstInt<true,false,long_long,false>(StrScanner *this)

{
  char *pcVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  optional<long_long> oVar3;
  undefined7 uStack_4f;
  undefined1 local_40 [8];
  optional<long_long> val;
  bool negate;
  int c;
  char *at;
  StrScanner *this_local;
  longlong local_10;
  
  skipCommentsAndWhitespaces<true,false>(this);
  pcVar1 = this->_at;
  val.super_type.m_storage._4_4_ = _scanAnyChar(this);
  if (val.super_type.m_storage._4_4_ < 0) {
    boost::optional<long_long>::optional((optional<long_long> *)&this_local);
    val.super_type._0_8_ = extraout_RAX;
  }
  else {
    val.super_type.m_storage._2_1_ = val.super_type.m_storage._4_4_ == 0x2d;
    if (!(bool)val.super_type.m_storage._2_1_) {
      this->_at = this->_at + -1;
    }
    boost::optional<long_long>::optional((optional<long_long> *)local_40);
    oVar3 = _tryScanConstInt<long_long,10>(this,(bool)(val.super_type.m_storage._2_1_ & 1));
    val.super_type._0_8_ = oVar3.super_type.m_storage;
    local_40._1_7_ = uStack_4f;
    local_40[0] = oVar3.super_type.m_initialized;
    bVar2 = boost::optional<long_long>::operator!((optional<long_long> *)local_40);
    if (bVar2) {
      this->_at = pcVar1;
    }
    this_local._0_1_ = local_40[0];
    local_10 = val.super_type._0_8_;
  }
  oVar3.super_type._1_7_ = val.super_type._1_7_;
  oVar3.super_type.m_initialized = (bool)this_local._0_1_;
  oVar3.super_type.m_storage = local_10;
  return (optional<long_long>)oVar3.super_type;
}

Assistant:

boost::optional<ValT> StrScanner::tryScanConstInt()
{
    static_assert(std::is_same<ValT, long long>::value ||
                  std::is_same<ValT, unsigned long long>::value,
                  "`ValT` is `long long` or `unsigned long long`.");

    this->skipCommentsAndWhitespaces<SkipWsV, SkipCommentsV>();

    const auto at = _at;
    const auto c = this->_scanAnyChar();

    if (c < 0) {
        // nothing left
        return boost::none;
    }

    // check for negation
    const bool negate = (c == '-');

    if (negate && !std::is_signed<ValT>::value) {
        _at = at;
        return boost::none;
    }

    if (!negate) {
        --_at;

        if (AllowPrefixV && c == '+') {
            ++_at;
        }
    }

    // check for radix prefix
    boost::optional<ValT> val;

    if (AllowPrefixV && *_at == '0' && this->charsLeft() >= 2) {
        if (_at[1] == 'b' || _at[1] == 'B' ||
                _at[1] == 'x' || _at[1] == 'X' ||
                (_at[1] >= '1' && _at[1] <= '9')) {
            if (_at[1] == 'b' || _at[1] == 'B') {
                // binary
                _at += 2;
                val = this->_tryScanConstBinInt<ValT>(negate);
            } else if (_at[1] == 'x' || _at[1] == 'X') {
                // hexadecimal
                _at += 2;
                val = this->_tryScanConstInt<ValT, 16>(negate);
            } else {
                // octal: leave prefix to catch 0 too
                assert(_at[1] >= '1' && _at[1] <= '9');
                val = this->_tryScanConstInt<ValT, 8>(negate);
            }

            if (!val) {
                _at = at;
                return boost::none;
            }

            return val;
        }
    }

    // fall back to decimal
    val = this->_tryScanConstInt<ValT, 10>(negate);

    if (!val) {
        // no constant integer
        _at = at;
    }

    return val;
}